

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

char * libssh2_session_hostkey(LIBSSH2_SESSION *session,size_t *len,int *type)

{
  uint uVar1;
  int iVar2;
  uchar *__s2;
  
  uVar1 = session->server_hostkey_len;
  if ((ulong)uVar1 == 0) {
    if (len != (size_t *)0x0) {
      *len = 0;
    }
    __s2 = (uchar *)0x0;
  }
  else {
    if (len != (size_t *)0x0) {
      *len = (ulong)uVar1;
    }
    __s2 = session->server_hostkey;
    if (type != (int *)0x0) {
      iVar2 = 0;
      if (10 < uVar1) {
        iVar2 = bcmp(&DAT_00125abd,__s2,0xb);
        if (iVar2 == 0) {
          iVar2 = 1;
        }
        else {
          iVar2 = bcmp(&DAT_00125ac8,__s2,0xb);
          iVar2 = (uint)(iVar2 == 0) * 2;
        }
      }
      *type = iVar2;
    }
  }
  return (char *)__s2;
}

Assistant:

LIBSSH2_API const char *
libssh2_session_hostkey(LIBSSH2_SESSION *session, size_t *len, int *type)
{
    if(session->server_hostkey_len) {
        if(len)
            *len = session->server_hostkey_len;
        if (type)
            *type = hostkey_type(session->server_hostkey,
                                 session->server_hostkey_len);
        return (char *) session->server_hostkey;
    }
    if(len)
        *len = 0;
    return NULL;
}